

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid_Image.cxx
# Opt level: O2

Fluid_Image * ui_find_image(char *oldname)

{
  char *iname;
  Fluid_Image *pFVar1;
  
  goto_source_dir();
  fl_file_chooser_ok_label("Use Image");
  iname = fl_file_chooser("Image?","Image Files (*.{bm,bmp,gif,jpg,pbm,pgm,png,ppm,xbm,xpm})",
                          oldname,1);
  pFVar1 = (Fluid_Image *)0x0;
  fl_file_chooser_ok_label((char *)0x0);
  ui_find_image_name = iname;
  if (iname != (char *)0x0) {
    if (*iname == '\0') {
      pFVar1 = (Fluid_Image *)0x0;
    }
    else {
      pFVar1 = Fluid_Image::find(iname);
    }
  }
  leave_source_dir();
  return pFVar1;
}

Assistant:

Fluid_Image *ui_find_image(const char *oldname) {
  goto_source_dir();
  fl_file_chooser_ok_label("Use Image");
  const char *name = fl_file_chooser("Image?","Image Files (*.{bm,bmp,gif,jpg,pbm,pgm,png,ppm,xbm,xpm})",oldname,1);
  fl_file_chooser_ok_label(NULL);
  ui_find_image_name = name;
  Fluid_Image *ret = (name && *name) ? Fluid_Image::find(name) : 0;
  leave_source_dir();
  return ret;
}